

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O1

void __thiscall FCommandBuffer::AddChar(FCommandBuffer *this,int character)

{
  char foo;
  char local_9;
  
  if (*(uint *)((this->Text).Chars + -0xc) == this->CursorPos) {
    FString::operator+=(&this->Text,(char)character);
  }
  else {
    local_9 = (char)character;
    FString::Insert(&this->Text,(ulong)this->CursorPos,&local_9,1);
  }
  this->CursorPos = this->CursorPos + 1;
  MakeStartPosGood(this);
  return;
}

Assistant:

void AddChar(int character)
	{
		///FIXME: Not Unicode-aware
		if (CursorPos == Text.Len())
		{
			Text += char(character);
		}
		else
		{
			char foo = char(character);
			Text.Insert(CursorPos, &foo, 1);
		}
		CursorPos++;
		MakeStartPosGood();
	}